

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O2

qint64 __thiscall
QUdpSocket::writeDatagram
          (QUdpSocket *this,char *data,qint64 size,QHostAddress *address,quint16 port)

{
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar1;
  bool bVar2;
  SocketState SVar3;
  SocketError errorCode;
  long lVar4;
  qintptr qVar5;
  socklen_t __len;
  QHostAddress *pQVar6;
  long in_FS_OFFSET;
  QIpPacketHeader local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&(this->super_QAbstractSocket).field_0x8;
  QHostAddress::QHostAddress(&local_60.senderAddress,Any);
  pQVar6 = address;
  bVar2 = QUdpSocketPrivate::doEnsureInitialized
                    ((QUdpSocketPrivate *)this_00,&local_60.senderAddress,0,address);
  __len = (socklen_t)pQVar6;
  QHostAddress::~QHostAddress(&local_60.senderAddress);
  lVar4 = -1;
  if (bVar2) {
    SVar3 = QAbstractSocket::state(&this->super_QAbstractSocket);
    if (SVar3 == UnconnectedState) {
      QAbstractSocket::bind(&this->super_QAbstractSocket,0,(sockaddr *)0x0,__len);
    }
    pQVar1 = this_00->socketEngine;
    QIpPacketHeader::QIpPacketHeader(&local_60,address,port);
    lVar4 = (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,data,size,&local_60);
    QIpPacketHeader::~QIpPacketHeader(&local_60);
    qVar5 = (**(code **)(*(long *)this_00->socketEngine + 0x70))();
    this_00->cachedSocketDescriptor = qVar5;
    if (lVar4 < 0) {
      if (lVar4 == -2) {
        tr((QString *)&local_60,"Unable to send a datagram",(char *)0x0,-1);
        QAbstractSocketPrivate::setErrorAndEmit(this_00,TemporaryError,(QString *)&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
        lVar4 = -1;
      }
      else {
        errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
        QAbstractSocketEngine::errorString
                  ((QString *)&local_60,(QAbstractSocketEngine *)this_00->socketEngine);
        QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,(QString *)&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      }
    }
    else {
      QIODevice::bytesWritten((longlong)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar4;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUdpSocket::writeDatagram(const char *data, qint64 size, const QHostAddress &address,
                                  quint16 port)
{
    Q_D(QUdpSocket);
#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::writeDatagram(%p, %llu, \"%s\", %i)", data, size,
           address.toString().toLatin1().constData(), port);
#endif
    if (!d->doEnsureInitialized(QHostAddress::Any, 0, address))
        return -1;
    if (state() == UnconnectedState)
        bind();

    qint64 sent = d->socketEngine->writeDatagram(data, size, QIpPacketHeader(address, port));
    d->cachedSocketDescriptor = d->socketEngine->socketDescriptor();

    if (sent >= 0) {
        emit bytesWritten(sent);
    } else {
        if (sent == -2) {
            // Socket engine reports EAGAIN. Treat as a temporary error.
            d->setErrorAndEmit(QAbstractSocket::TemporaryError,
                               tr("Unable to send a datagram"));
            return -1;
        }
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
    }
    return sent;
}